

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider.cpp
# Opt level: O3

Provider * parseProvider(Provider *__return_storage_ptr__,QString *filename)

{
  QString *pQVar1;
  TraceEnum *pTVar2;
  QtPrivate *pQVar3;
  TraceFlags *pTVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  char16_t *pcVar9;
  Data *pDVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  qlonglong qVar19;
  QString *pQVar20;
  storage_type_conflict *psVar21;
  undefined4 uVar22;
  long lVar23;
  bool *ok;
  QChar *pQVar24;
  int __oflag;
  char *pcVar25;
  QString *offset;
  size_t i;
  Data *pDVar26;
  EnumValue *pEVar27;
  long lVar28;
  uint uVar29;
  QtPrivate *pQVar30;
  qsizetype qVar31;
  Argument *this;
  QArrayData *pQVar32;
  ulong in_R8;
  long lVar33;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QLatin1StringView s_00;
  QStringView string;
  QStringView string_00;
  QStringView string_01;
  QStringView lhs_03;
  QStringView lhs_04;
  QStringView lhs_05;
  QLatin1StringView s_01;
  QStringView lhs_06;
  QStringView string_02;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QLatin1StringView rhs_01;
  QLatin1StringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QLatin1StringView rhs_05;
  QLatin1StringView rhs_06;
  QRegularExpressionMatch match;
  QTextStream s;
  QRegularExpressionMatch match_2;
  QRegularExpressionMatch m;
  QRegularExpressionMatch match_1;
  uint local_460;
  uint local_45c;
  uint local_458;
  Tracepoint local_3f8;
  QArrayDataPointer<QString> local_3a8;
  QString local_388;
  QString local_368;
  undefined1 local_350 [48];
  EnumValue *pEStack_320;
  QtPrivate *local_318;
  QArrayDataPointer<TraceFlags::FlagValue> QStack_310;
  QTextStream local_2f0;
  QIODevice local_2e8;
  QString local_2d0;
  QString local_2b8;
  QArrayData *local_298;
  QtPrivate *pQStack_290;
  storage_type_conflict *local_288;
  QArrayDataPointer<TraceFlags::FlagValue> QStack_280;
  QString local_260;
  QString local_248;
  QString local_228;
  QRegularExpressionMatch local_210 [7];
  QString local_1d8 [3];
  QString local_190;
  QString local_178;
  undefined1 local_158 [64];
  QRegularExpressionMatch local_118;
  QtPrivate *pQStack_110;
  storage_type_conflict *local_108;
  QArrayDataPointer<TraceEnum::EnumValue> QStack_100;
  undefined8 local_e8;
  undefined1 local_d8 [60];
  undefined4 uStack_9c;
  EnumValue *local_98;
  QtPrivate *pQStack_90;
  storage_type_conflict *local_88;
  Argument local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2e8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_2e8.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_2e8,filename);
  iVar16 = QFile::open((QFile *)&local_2e8,(char *)0x11,__oflag);
  if ((char)iVar16 == '\0') {
    QString::toLocal8Bit_helper
              ((QByteArray *)local_d8,(QChar *)(filename->d).ptr,(filename->d).size);
    pDVar26 = (Data *)local_d8._8_8_;
    if ((Data *)local_d8._8_8_ == (Data *)0x0) {
      pDVar26 = (Data *)"";
    }
    QIODevice::errorString(&local_78.type,&local_2e8);
    QString::toLocal8Bit_helper
              ((QByteArray *)&local_3f8,(QChar *)local_78.type.d.ptr,local_78.type.d.size);
    pcVar25 = (char *)local_3f8.name.d.ptr;
    if ((EnumValue *)local_3f8.name.d.ptr == (EnumValue *)0x0) {
      pcVar25 = "";
    }
    panic("Cannot open %s: %s",pDVar26,pcVar25);
    if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_78.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_78.type.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
      }
    }
  }
  local_2f0.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&local_2f0,&local_2e8);
  if (parseProvider(QString_const&)::tracedef == '\0') {
    parseProvider();
  }
  if (parseProvider(QString_const&)::enumenddef == '\0') {
    parseProvider();
  }
  if (parseProvider(QString_const&)::enumdef == '\0') {
    parseProvider();
  }
  if (parseProvider(QString_const&)::rangedef == '\0') {
    parseProvider();
  }
  (__return_storage_ptr__->flags).d.d = (Data *)0x0;
  (__return_storage_ptr__->flags).d.ptr = (TraceFlags *)0x0;
  (__return_storage_ptr__->enumerations).d.ptr = (TraceEnum *)0x0;
  (__return_storage_ptr__->enumerations).d.size = 0;
  (__return_storage_ptr__->prefixText).d.size = 0;
  (__return_storage_ptr__->enumerations).d.d = (Data *)0x0;
  (__return_storage_ptr__->prefixText).d.d = (Data *)0x0;
  (__return_storage_ptr__->prefixText).d.ptr = (QString *)0x0;
  (__return_storage_ptr__->tracepoints).d.ptr = (Tracepoint *)0x0;
  (__return_storage_ptr__->tracepoints).d.size = 0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->tracepoints).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->flags).d.size = 0;
  QFileInfo::QFileInfo((QFileInfo *)&local_3f8,filename);
  QFileInfo::baseName((QString *)local_d8,(QFileInfo *)&local_3f8);
  pQVar32 = &((__return_storage_ptr__->name).d.d)->super_QArrayData;
  pEVar27 = (EnumValue *)(__return_storage_ptr__->name).d.ptr;
  (__return_storage_ptr__->name).d.d = (Data *)local_d8._0_8_;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)local_d8._8_8_;
  pQVar30 = (QtPrivate *)(__return_storage_ptr__->name).d.size;
  (__return_storage_ptr__->name).d.size = local_d8._16_8_;
  local_d8._0_8_ = pQVar32;
  local_d8._8_8_ = pEVar27;
  local_d8._16_8_ = pQVar30;
  if (pQVar32 != (QArrayData *)0x0) {
    LOCK();
    (pQVar32->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar32->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar32->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar32,2,0x10);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_3f8);
  local_158._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_158._0_8_ = (QArrayData *)0x0;
  local_158._8_8_ = (Data *)0x0;
  local_158._16_8_ = (char16_t *)0x0;
  local_158._24_8_ = (QArrayData *)0x0;
  local_158._32_8_ = (EnumValue *)0x0;
  local_158._40_8_ = (QtPrivate *)0x0;
  QStack_310.ptr = (FlagValue *)0x0;
  QStack_310.size = 0;
  local_318 = (QtPrivate *)0x0;
  QStack_310.d = (Data *)0x0;
  local_350._40_8_ = (QArrayData *)0x0;
  pEStack_320 = (EnumValue *)0x0;
  bVar14 = QTextStream::atEnd(&local_2f0);
  if (!bVar14) {
    local_45c = 0x80000000;
    local_458 = 0x7fffffff;
    uVar29 = 1;
    bVar14 = false;
    bVar7 = false;
    bVar6 = false;
    local_460 = 0;
    do {
      local_350._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_350._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_350._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextStream::readLine((QString *)local_d8,&local_2f0,0);
      QString::trimmed_helper((QString *)(local_350 + 8),(QString *)local_d8);
      if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
        }
      }
      uVar8 = local_350._16_8_;
      if ((Data *)local_350._24_8_ == (Data *)0x1) {
        lhs.m_size = (qsizetype)"{";
        lhs.m_data = (storage_type_conflict *)0x1;
        rhs.m_size = in_R8;
        rhs.m_data = (char *)0x1;
        bVar15 = QtPrivate::equalStrings((QtPrivate *)local_350._16_8_,lhs,rhs);
        if (bVar15) {
          bVar14 = true;
        }
        else {
          if (!bVar14) goto LAB_0010ffa2;
          lhs_00.m_size = (qsizetype)"}";
          lhs_00.m_data = (storage_type_conflict *)0x1;
          rhs_00.m_size = in_R8;
          rhs_00.m_data = (char *)0x1;
          bVar15 = QtPrivate::equalStrings((QtPrivate *)uVar8,lhs_00,rhs_00);
          if (!bVar15) goto LAB_0010fee1;
          bVar14 = false;
        }
      }
      else if (bVar14) {
LAB_0010fee1:
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&__return_storage_ptr__->prefixText,
                   (__return_storage_ptr__->prefixText).d.size,(QString *)(local_350 + 8));
        QList<QString>::end(&__return_storage_ptr__->prefixText);
      }
      else if ((Data *)local_350._24_8_ == (Data *)0x7) {
        lhs_02.m_size = (qsizetype)"FLAGS {";
        lhs_02.m_data = (storage_type_conflict *)0x7;
        rhs_02.m_size = in_R8;
        rhs_02.m_data = (char *)0x7;
        bVar15 = QtPrivate::equalStrings((QtPrivate *)local_350._16_8_,lhs_02,rhs_02);
        if (!bVar15) goto LAB_0010ffa2;
        bVar7 = true;
      }
      else if (((Data *)local_350._24_8_ == (Data *)0x6) &&
              (lhs_01.m_size = (qsizetype)"ENUM {", lhs_01.m_data = (storage_type_conflict *)0x6,
              rhs_01.m_size = in_R8, rhs_01.m_data = (char *)0x6,
              bVar15 = QtPrivate::equalStrings((QtPrivate *)local_350._16_8_,lhs_01,rhs_01), bVar15)
              ) {
        bVar6 = true;
      }
      else {
LAB_0010ffa2:
        s_00.m_size = 1;
        s_00.m_data = "}";
        bVar15 = QString::startsWith((QString *)(local_350 + 8),s_00,CaseSensitive);
        if ((bVar15) && ((bVar6 || (bVar7)))) {
          local_78.type.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          in_R8 = 0;
          QRegularExpression::match
                    ((QRegularExpression *)&local_78,(QString *)&parseProvider::enumenddef,
                     (qsizetype)(local_350 + 8),NormalMatch,(MatchOptions)0x0);
          bVar15 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)&local_78);
          if (bVar15) {
            if (bVar6) {
              QRegularExpressionMatch::captured
                        ((QString *)local_d8,(QRegularExpressionMatch *)&local_78,1);
              uVar13 = local_d8._16_8_;
              uVar12 = local_d8._0_8_;
              uVar11 = local_158._8_8_;
              uVar8 = local_158._0_8_;
              local_d8._0_8_ = local_158._0_8_;
              local_158._0_8_ = uVar12;
              local_158._8_8_ = local_d8._8_8_;
              local_d8._8_8_ = uVar11;
              local_d8._16_8_ = local_158._16_8_;
              local_158._16_8_ = uVar13;
              if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
                }
              }
              if ((int)local_458 < 0) {
                if (((0x7f < (int)local_45c) || (iVar16 = 8, local_458 < 0xffffff80)) &&
                   (iVar16 = (uint)(local_458 < 0xffff8000) * 0x10 + 0x10, 0x7fff < (int)local_45c))
                {
                  iVar16 = 0x20;
                }
              }
              else {
                iVar16 = 8;
                if (0xff < (int)local_45c) {
                  iVar16 = (uint)(0xffff < local_45c) * 0x10 + 0x10;
                }
              }
              local_158._48_4_ = iVar16;
              QtPrivate::QMovableArrayOps<TraceEnum>::emplace<TraceEnum_const&>
                        ((QMovableArrayOps<TraceEnum> *)&__return_storage_ptr__->enumerations,
                         (__return_storage_ptr__->enumerations).d.size,(TraceEnum *)local_158);
              QList<TraceEnum>::end(&__return_storage_ptr__->enumerations);
              local_3f8.name.d.size = local_158._40_8_;
              local_3f8.name.d.ptr = (char16_t *)local_158._32_8_;
              local_3f8.name.d.d = (Data *)local_158._24_8_;
              local_d8._16_8_ = local_158._16_8_;
              local_d8._8_8_ = local_158._8_8_;
              local_d8._0_8_ = local_158._0_8_;
              local_d8._48_8_ = 0;
              local_158._0_8_ = (QArrayData *)0x0;
              local_158._8_8_ = (Data *)0x0;
              local_158._16_8_ = (char16_t *)0x0;
              local_d8._40_8_ = (char16_t *)0x0;
              local_d8._24_8_ = (storage_type_conflict *)0x0;
              local_d8._32_8_ = (QArrayData *)0x0;
              local_158._24_8_ = (QArrayData *)0x0;
              local_158._32_8_ = (EnumValue *)0x0;
              local_158._40_8_ = (QtPrivate *)0x0;
              QArrayDataPointer<TraceEnum::EnumValue>::~QArrayDataPointer
                        ((QArrayDataPointer<TraceEnum::EnumValue> *)&local_3f8);
              local_158._48_4_ = local_d8._48_4_;
              QArrayDataPointer<TraceEnum::EnumValue>::~QArrayDataPointer
                        ((QArrayDataPointer<TraceEnum::EnumValue> *)(local_d8 + 0x18));
              if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                }
              }
              bVar6 = false;
            }
            else {
              QRegularExpressionMatch::captured
                        ((QString *)local_d8,(QRegularExpressionMatch *)&local_78,1);
              uVar12 = local_d8._16_8_;
              uVar11 = local_d8._0_8_;
              pEVar27 = pEStack_320;
              uVar8 = local_350._40_8_;
              local_d8._0_8_ = local_350._40_8_;
              local_350._40_8_ = uVar11;
              pEStack_320 = (EnumValue *)local_d8._8_8_;
              local_d8._8_8_ = pEVar27;
              local_d8._16_8_ = local_318;
              local_318 = (QtPrivate *)uVar12;
              if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
                }
              }
              QtPrivate::QMovableArrayOps<TraceFlags>::emplace<TraceFlags_const&>
                        ((QMovableArrayOps<TraceFlags> *)&__return_storage_ptr__->flags,
                         (__return_storage_ptr__->flags).d.size,(TraceFlags *)(local_350 + 0x28));
              QList<TraceFlags>::end(&__return_storage_ptr__->flags);
              local_3f8.name.d.size = QStack_310.size;
              local_3f8.name.d.ptr = (char16_t *)QStack_310.ptr;
              local_3f8.name.d.d = (Data *)QStack_310.d;
              local_d8._16_8_ = local_318;
              local_d8._8_8_ = pEStack_320;
              local_d8._0_8_ = local_350._40_8_;
              local_350._40_8_ = (QArrayData *)0x0;
              pEStack_320 = (EnumValue *)0x0;
              local_318 = (QtPrivate *)0x0;
              local_d8._40_8_ = (char16_t *)0x0;
              local_d8._24_8_ = (storage_type_conflict *)0x0;
              local_d8._32_8_ = (QArrayData *)0x0;
              QStack_310.d = (Data *)0x0;
              QStack_310.ptr = (FlagValue *)0x0;
              QStack_310.size = 0;
              QArrayDataPointer<TraceFlags::FlagValue>::~QArrayDataPointer
                        ((QArrayDataPointer<TraceFlags::FlagValue> *)&local_3f8);
              QArrayDataPointer<TraceFlags::FlagValue>::~QArrayDataPointer
                        ((QArrayDataPointer<TraceFlags::FlagValue> *)(local_d8 + 0x18));
              if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                }
              }
              bVar7 = false;
            }
            local_458 = 0x7fffffff;
            local_45c = 0x80000000;
          }
          else {
            QString::toLocal8Bit_helper
                      ((QByteArray *)local_d8,(QChar *)(filename->d).ptr,(filename->d).size);
            pEVar27 = (EnumValue *)local_d8._8_8_;
            if ((EnumValue *)local_d8._8_8_ == (EnumValue *)0x0) {
              pEVar27 = (EnumValue *)"";
            }
            QString::toLocal8Bit_helper
                      ((QByteArray *)&local_3f8,(QChar *)local_350._16_8_,local_350._24_8_);
            pcVar25 = (char *)local_3f8.name.d.ptr;
            if ((EnumValue *)local_3f8.name.d.ptr == (EnumValue *)0x0) {
              pcVar25 = "";
            }
            panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' end of enum/flags does not match"
                  ,pEVar27,(ulong)uVar29,pcVar25);
            if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,1,0x10);
              }
            }
            if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
              }
            }
          }
          this = &local_78;
LAB_00111a03:
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)this);
        }
        else if (((Data *)local_350._24_8_ != (Data *)0x0) &&
                (bVar15 = QString::startsWith((QString *)(local_350 + 8),(QChar)0x23,CaseSensitive),
                !bVar15)) {
          if (bVar6) {
            local_118.d.d.ptr =
                 (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa
            ;
            in_R8 = 0;
            QRegularExpression::match
                      ((QRegularExpression *)&local_118,(QString *)&parseProvider::enumdef,
                       (qsizetype)(local_350 + 8),NormalMatch,(MatchOptions)0x0);
            local_d8._0_8_ = (QArrayData *)0x0;
            local_d8._8_8_ = L"RANGE";
            local_d8._16_8_ = (QtPrivate *)0x5;
            bVar15 = QString::startsWith((QString *)(local_350 + 8),(QString *)local_d8,
                                         CaseSensitive);
            if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
              }
            }
            if (!bVar15) goto LAB_001104da;
            local_78.type.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            in_R8 = 0;
            QRegularExpression::match
                      ((QRegularExpression *)&local_78,(QString *)&parseProvider::rangedef,
                       (qsizetype)(local_350 + 8),NormalMatch,(MatchOptions)0x0);
            bVar15 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)&local_78);
            if (bVar15) {
              local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._0_8_ = (QArrayData *)0x0;
              local_d8._8_8_ = (EnumValue *)0x0;
              local_d8._16_8_ = (QtPrivate *)0x0;
              QRegularExpressionMatch::captured
                        (&local_3f8.name,(QRegularExpressionMatch *)&local_78,1);
              uVar11 = local_d8._8_8_;
              uVar8 = local_d8._0_8_;
              qVar31 = local_3f8.name.d.size;
              pDVar26 = local_3f8.name.d.d;
              local_3f8.name.d.d = (Data *)local_d8._0_8_;
              local_d8._0_8_ = pDVar26;
              local_d8._8_8_ = local_3f8.name.d.ptr;
              local_3f8.name.d.ptr = (char16_t *)uVar11;
              local_3f8.name.d.size = local_d8._16_8_;
              local_d8._16_8_ = qVar31;
              if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
                }
              }
              QRegularExpressionMatch::captured
                        (&local_3f8.name,(QRegularExpressionMatch *)&local_78,2);
              string.m_size = 0;
              string.m_data = (storage_type_conflict *)local_3f8.name.d.size;
              qVar19 = QString::toIntegral_helper
                                 ((QString *)local_3f8.name.d.ptr,string,(bool *)0xa,(int)in_R8);
              iVar16 = (int)qVar19;
              if (iVar16 != qVar19) {
                iVar16 = 0;
              }
              local_d8._24_4_ = iVar16;
              if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,2,0x10);
                }
              }
              QRegularExpressionMatch::captured
                        (&local_3f8.name,(QRegularExpressionMatch *)&local_78,3);
              string_00.m_size = 0;
              string_00.m_data = (storage_type_conflict *)local_3f8.name.d.size;
              qVar19 = QString::toIntegral_helper
                                 ((QString *)local_3f8.name.d.ptr,string_00,(bool *)0xa,(int)in_R8);
              iVar16 = (int)qVar19;
              if (iVar16 != qVar19) {
                iVar16 = 0;
              }
              local_d8._28_4_ = iVar16;
              if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,2,0x10);
                }
              }
              uVar22 = local_d8._28_4_;
              QtPrivate::QGenericArrayOps<TraceEnum::EnumValue>::
              emplace<TraceEnum::EnumValue_const&>
                        ((QGenericArrayOps<TraceEnum::EnumValue> *)(local_158 + 0x18),
                         local_158._40_8_,(EnumValue *)local_d8);
              QList<TraceEnum::EnumValue>::end((QList<TraceEnum::EnumValue> *)(local_158 + 0x18));
              uVar18 = local_d8._28_4_;
              if ((int)local_d8._28_4_ < (int)local_45c) {
                uVar18 = local_45c;
              }
              uVar5 = local_d8._24_4_;
              if ((int)local_458 < (int)local_d8._24_4_) {
                uVar5 = local_458;
              }
              if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                }
              }
              local_460 = uVar22 + 1;
              local_458 = uVar5;
              local_45c = uVar18;
            }
            QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_78);
          }
          else {
            if (!bVar7) {
              local_350._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              in_R8 = 0;
              QRegularExpression::match
                        ((QRegularExpression *)local_350,(QString *)&parseProvider::tracedef,
                         (qsizetype)(local_350 + 8),NormalMatch,(MatchOptions)0x0);
              bVar15 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)local_350);
              if (bVar15) {
                local_368.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_368.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_368.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QRegularExpressionMatch::captured(&local_368,(QRegularExpressionMatch *)local_350,1)
                ;
                local_388.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_388.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_388.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QRegularExpressionMatch::captured(&local_388,(QRegularExpressionMatch *)local_350,2)
                ;
                local_3a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_3a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_3a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                in_R8 = 1;
                QString::split((QStringList *)&local_3a8,&local_388,(QChar)0x2c,(SplitBehavior)0x1,
                               CaseSensitive);
                local_3f8.name.d.d = (Data *)0x0;
                local_3f8.name.d.ptr = (char16_t *)0x0;
                local_3f8.name.d.size = 0;
                local_3f8.args.d.d = (Data *)0x0;
                local_3f8.args.d.ptr = (Argument *)0x0;
                local_3f8.args.d.size = 0;
                local_3f8.fields.d.d = (Data *)0x0;
                local_3f8.fields.d.ptr = (Field *)0x0;
                local_3f8.fields.d.size = 0;
                QString::operator=(&local_3f8.name,&local_368);
                qVar31 = local_3a8.size;
                offset = local_3a8.ptr;
                if ((undefined1 *)local_3a8.size != (undefined1 *)0x0) {
                  if (parseTracepoint(Provider_const&,QString_const&,QList<QString>const&,QString_const&,int)
                      ::rx == '\0') {
                    parseProvider();
                  }
                  pQVar1 = offset + qVar31;
                  do {
                    local_210[0].d.d.ptr =
                         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                         &DAT_aaaaaaaaaaaaaaaa;
                    in_R8 = 0;
                    QRegularExpression::match
                              ((QRegularExpression *)local_210,
                               (QString *)
                               &parseTracepoint(Provider_const&,QString_const&,QList<QString>const&,QString_const&,int)
                                ::rx,(qsizetype)offset,NormalMatch,(MatchOptions)0x0);
                    local_228.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_228.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_228.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QRegularExpressionMatch::captured((QString *)local_d8,local_210,1);
                    QString::trimmed_helper(&local_228,(QString *)local_d8);
                    if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                      }
                    }
                    if ((QtPrivate *)local_228.d.ptr == (QtPrivate *)0x0) {
                      QString::toLocal8Bit_helper
                                ((QByteArray *)local_d8,(QChar *)local_368.d.ptr,local_368.d.size);
                      pEVar27 = (EnumValue *)local_d8._8_8_;
                      if ((EnumValue *)local_d8._8_8_ == (EnumValue *)0x0) {
                        pEVar27 = (EnumValue *)"";
                      }
                      QString::toLocal8Bit_helper
                                ((QByteArray *)&local_78,(QChar *)(filename->d).ptr,
                                 (filename->d).size);
                      in_R8 = (ulong)uVar29;
                      panic("Missing parameter type for argument %d of %s (%s:%d)",0,pEVar27);
                      if (&(local_78.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i =
                             ((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_78.type.d.d)->super_QArrayData,1,0x10);
                        }
                      }
                      if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>
                            ._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
                        }
                      }
                    }
                    local_248.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_248.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_248.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QRegularExpressionMatch::captured((QString *)local_d8,local_210,2);
                    QString::trimmed_helper(&local_248,(QString *)local_d8);
                    if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                      }
                    }
                    if (local_248.d.ptr == (char16_t *)0x0) {
                      QString::toLocal8Bit_helper
                                ((QByteArray *)local_d8,(QChar *)0x0,local_248.d.size);
                      pEVar27 = (EnumValue *)local_d8._8_8_;
                      if ((EnumValue *)local_d8._8_8_ == (EnumValue *)0x0) {
                        pEVar27 = (EnumValue *)"";
                      }
                      QString::toLocal8Bit_helper
                                ((QByteArray *)&local_78,(QChar *)(filename->d).ptr,
                                 (filename->d).size);
                      in_R8 = (ulong)uVar29;
                      panic("Missing parameter name for argument %d of %s (%s:%d)",0,pEVar27);
                      if (&(local_78.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i =
                             ((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_78.type.d.d)->super_QArrayData,1,0x10);
                        }
                      }
                      if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                        LOCK();
                        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i = (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>
                            ._M_i == 0) {
                          QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
                        }
                      }
                    }
                    iVar16 = arrayLength(&local_228);
                    local_78.type.d.d = (Data *)0x0;
                    local_78.type.d.ptr = (char16_t *)0x0;
                    local_78.type.d.size = 0;
                    local_78.name.d.d = (Data *)0x0;
                    local_78.name.d.ptr = (char16_t *)0x0;
                    local_78.name.d.size = 0;
                    local_78._52_4_ = 0xaaaaaaaa;
                    local_78.arrayLen = iVar16;
                    QString::operator=(&local_78.name,&local_248);
                    local_260.d.d = local_228.d.d;
                    local_260.d.ptr = local_228.d.ptr;
                    local_260.d.size = local_228.d.size;
                    if ((EnumValue *)local_228.d.d != (EnumValue *)0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(((QString *)&(local_228.d.d)->super_QArrayData)->d).d
                      )->_M_i = ((__atomic_base<int> *)
                                &(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->_M_i + 1;
                      UNLOCK();
                    }
                    if (decayArrayToPointer(QString)::rx == '\0') {
                      parseProvider();
                    }
                    local_d8._0_8_ = (QArrayData *)0x0;
                    local_d8._8_8_ = L"*";
                    local_d8._16_8_ = (char16_t *)0x1;
                    pQVar20 = QString::replace(&local_260,
                                               (QRegularExpression *)
                                               &decayArrayToPointer(QString)::rx,(QString *)local_d8
                                              );
                    pQVar32 = &((pQVar20->d).d)->super_QArrayData;
                    pQVar24 = (QChar *)(pQVar20->d).ptr;
                    qVar31 = (pQVar20->d).size;
                    if (pQVar32 != (QArrayData *)0x0) {
                      LOCK();
                      (((QArrayData *)&pQVar32->ref_)->ref_)._q_value.super___atomic_base<int>._M_i
                           = (((QArrayData *)&pQVar32->ref_)->ref_)._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                      }
                    }
                    pDVar26 = local_78.type.d.d;
                    local_78.type.d.ptr = (char16_t *)pQVar24;
                    local_78.type.d.size = qVar31;
                    if (&(local_78.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                      ._M_i = ((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        local_78.type.d.d = (Data *)pQVar32;
                        QArrayData::deallocate(&pDVar26->super_QArrayData,2,0x10);
                        pQVar32 = &(local_78.type.d.d)->super_QArrayData;
                      }
                    }
                    local_78.type.d.d = (Data *)pQVar32;
                    if ((EnumValue *)local_260.d.d != (EnumValue *)0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(((QString *)&(local_260.d.d)->super_QArrayData)->d).d
                      )->_M_i = ((__atomic_base<int> *)
                                &(((QString *)&(local_260.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                      UNLOCK();
                      if (((__atomic_base<int> *)
                          &(((QString *)&(local_260.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                        QArrayData::deallocate(&(local_260.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QtPrivate::QMovableArrayOps<Tracepoint::Argument>::emplace<Tracepoint::Argument>
                              ((QMovableArrayOps<Tracepoint::Argument> *)&local_3f8.args,
                               local_3f8.args.d.size,&local_78);
                    QList<Tracepoint::Argument>::end(&local_3f8.args);
                    psVar21 = (storage_type_conflict *)local_228.d.size;
                    pQVar30 = (QtPrivate *)local_228.d.ptr;
                    stack0xffffffffffffff60 = &DAT_aaaaaaaaaaaaaaaa;
                    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_98 = (EnumValue *)0x0;
                    pQStack_90 = (QtPrivate *)0x0;
                    local_88 = (storage_type_conflict *)0x0;
                    local_d8._40_8_ = (char16_t *)0x0;
                    local_d8._48_8_ = 0;
                    local_d8._24_8_ = 0;
                    local_d8._32_8_ = (QArrayData *)0x0;
                    local_d8._8_8_ = (QArrayData *)0x0;
                    local_d8._16_8_ = (char16_t *)0x0;
                    lVar28 = (__return_storage_ptr__->enumerations).d.size;
                    if (lVar28 != 0) {
                      pTVar2 = (__return_storage_ptr__->enumerations).d.ptr;
                      lVar33 = 0;
                      do {
                        if (*(storage_type_conflict **)((long)&(pTVar2->name).d.size + lVar33) ==
                            psVar21) {
                          pQVar3 = *(QtPrivate **)((long)&(pTVar2->name).d.ptr + lVar33);
                          lhs_03.m_size = (qsizetype)pQVar30;
                          lhs_03.m_data = psVar21;
                          rhs_03.m_size = in_R8;
                          rhs_03.m_data = psVar21;
                          bVar15 = QtPrivate::equalStrings(pQVar3,lhs_03,rhs_03);
                          if (bVar15) {
                            local_118.d.d.ptr =
                                 (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                                 ((totally_ordered_wrapper<QRegularExpressionMatchPrivate_*> *)
                                 ((long)&(pTVar2->name).d.d + lVar33))->ptr;
                            local_108 = psVar21;
                            if (local_118.d.d.ptr !=
                                (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0) {
                              LOCK();
                              *(int *)local_118.d.d.ptr = *(int *)local_118.d.d.ptr + 1;
                              UNLOCK();
                            }
                            QStack_100.d = *(Data **)((long)&(pTVar2->values).d.d + lVar33);
                            QStack_100.ptr = *(EnumValue **)((long)&(pTVar2->values).d.ptr + lVar33)
                            ;
                            QStack_100.size =
                                 *(qsizetype *)((long)&(pTVar2->values).d.size + lVar33);
                            if (QStack_100.d != (Data *)0x0) {
                              LOCK();
                              ((QStack_100.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i =
                                   ((QStack_100.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + 1;
                              UNLOCK();
                            }
                            local_e8 = CONCAT44(local_e8._4_4_,
                                                *(undefined4 *)((long)&pTVar2->valueSize + lVar33));
                            pQVar30 = (QtPrivate *)local_228.d.ptr;
                            psVar21 = (storage_type_conflict *)local_228.d.size;
                            pQStack_110 = pQVar3;
                            goto LAB_00110ea5;
                          }
                        }
                        lVar33 = lVar33 + 0x38;
                      } while (lVar28 * 0x38 - lVar33 != 0);
                    }
                    QStack_100.ptr = (EnumValue *)0x0;
                    QStack_100.size = 0;
                    local_108 = (storage_type_conflict *)0x0;
                    QStack_100.d = (Data *)0x0;
                    local_118.d.d.ptr =
                         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                         (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
                    pQStack_110 = (QtPrivate *)0x0;
                    local_e8 = 0;
LAB_00110ea5:
                    lVar28 = (__return_storage_ptr__->flags).d.size;
                    if (lVar28 != 0) {
                      pTVar4 = (__return_storage_ptr__->flags).d.ptr;
                      lVar33 = 0;
                      do {
                        if (*(storage_type_conflict **)((long)&(pTVar4->name).d.size + lVar33) ==
                            psVar21) {
                          pQVar3 = *(QtPrivate **)((long)&(pTVar4->name).d.ptr + lVar33);
                          lhs_04.m_size = (qsizetype)pQVar30;
                          lhs_04.m_data = psVar21;
                          rhs_04.m_size = in_R8;
                          rhs_04.m_data = psVar21;
                          bVar15 = QtPrivate::equalStrings(pQVar3,lhs_04,rhs_04);
                          if (bVar15) {
                            local_298 = *(QArrayData **)((long)&(pTVar4->name).d.d + lVar33);
                            if (local_298 != (QArrayData *)0x0) {
                              LOCK();
                              (local_298->ref_)._q_value.super___atomic_base<int>._M_i =
                                   (local_298->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                              UNLOCK();
                            }
                            QStack_280.d = *(Data **)((long)&(pTVar4->values).d.d + lVar33);
                            QStack_280.ptr = *(FlagValue **)((long)&(pTVar4->values).d.ptr + lVar33)
                            ;
                            QStack_280.size =
                                 *(qsizetype *)((long)&(pTVar4->values).d.size + lVar33);
                            pQStack_290 = pQVar3;
                            local_288 = psVar21;
                            if (QStack_280.d != (Data *)0x0) {
                              LOCK();
                              ((QStack_280.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i =
                                   ((QStack_280.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + 1;
                              UNLOCK();
                            }
                            goto LAB_00110f23;
                          }
                        }
                        lVar33 = lVar33 + 0x30;
                      } while (lVar28 * 0x30 != lVar33);
                    }
                    QStack_280.ptr = (FlagValue *)0x0;
                    QStack_280.size = 0;
                    local_288 = (storage_type_conflict *)0x0;
                    QStack_280.d = (Data *)0x0;
                    local_298 = (QArrayData *)0x0;
                    pQStack_290 = (QtPrivate *)0x0;
LAB_00110f23:
                    if (local_108 == (storage_type_conflict *)0x0) {
                      if (local_288 == (storage_type_conflict *)0x0) {
                        local_2b8.d.d = local_228.d.d;
                        local_2b8.d.ptr = local_228.d.ptr;
                        local_2b8.d.size = local_228.d.size;
                        if ((EnumValue *)local_228.d.d != (EnumValue *)0x0) {
                          LOCK();
                          ((__atomic_base<int> *)
                          &(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->_M_i =
                               ((__atomic_base<int> *)
                               &(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->_M_i + 1;
                          UNLOCK();
                        }
                        iVar17 = arrayLength(&local_2b8);
                        if (0 < iVar17) {
                          local_190.d.d = local_2b8.d.d;
                          local_190.d.ptr = local_2b8.d.ptr;
                          local_190.d.size = local_2b8.d.size;
                          if ((EnumValue *)local_2b8.d.d != (EnumValue *)0x0) {
                            LOCK();
                            ((__atomic_base<int> *)
                            &(((QString *)&(local_2b8.d.d)->super_QArrayData)->d).d)->_M_i =
                                 ((__atomic_base<int> *)
                                 &(((QString *)&(local_2b8.d.d)->super_QArrayData)->d).d)->_M_i + 1;
                            UNLOCK();
                          }
                          removeBraces(&local_178,&local_190);
                          qVar31 = local_178.d.size;
                          pDVar10 = local_178.d.d;
                          pcVar9 = local_2b8.d.ptr;
                          pDVar26 = local_2b8.d.d;
                          local_178.d.d = local_2b8.d.d;
                          local_2b8.d.d = pDVar10;
                          local_2b8.d.ptr = local_178.d.ptr;
                          local_178.d.ptr = pcVar9;
                          local_178.d.size = local_2b8.d.size;
                          local_2b8.d.size = qVar31;
                          if ((EnumValue *)pDVar26 != (EnumValue *)0x0) {
                            LOCK();
                            ((__atomic_base<int> *)&(((QString *)&pDVar26->super_QArrayData)->d).d)
                            ->_M_i = ((__atomic_base<int> *)
                                     &(((QString *)&pDVar26->super_QArrayData)->d).d)->_M_i + -1;
                            UNLOCK();
                            if (((__atomic_base<int> *)
                                &(((QString *)&pDVar26->super_QArrayData)->d).d)->_M_i == 0) {
                              QArrayData::deallocate(&pDVar26->super_QArrayData,2,0x10);
                            }
                          }
                          if ((EnumValue *)local_190.d.d != (EnumValue *)0x0) {
                            LOCK();
                            ((__atomic_base<int> *)
                            &(((QString *)&(local_190.d.d)->super_QArrayData)->d).d)->_M_i =
                                 ((__atomic_base<int> *)
                                 &(((QString *)&(local_190.d.d)->super_QArrayData)->d).d)->_M_i + -1
                            ;
                            UNLOCK();
                            if (((__atomic_base<int> *)
                                &(((QString *)&(local_190.d.d)->super_QArrayData)->d).d)->_M_i == 0)
                            {
                              QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                        }
                        sequenceLength(&local_178,&local_2b8);
                        pcVar9 = local_178.d.ptr;
                        if ((EnumValue *)local_178.d.d != (EnumValue *)0x0) {
                          LOCK();
                          ((__atomic_base<int> *)
                          &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i =
                               ((__atomic_base<int> *)
                               &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                          UNLOCK();
                          if (((__atomic_base<int> *)
                              &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        uVar22 = 0;
                        if ((QtPrivate *)pcVar9 == (QtPrivate *)0x0) {
                          if (backendType(QString)::constMatch == '\0') {
                            parseProvider();
                          }
                          local_178.d.d = (Data *)0x0;
                          local_178.d.ptr = (char16_t *)0x0;
                          local_178.d.size = 0;
                          QString::replace(&local_2b8,
                                           (QRegularExpression *)&backendType(QString)::constMatch,
                                           &local_178);
                          if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_178.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_178.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_178.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          QString::remove(&local_2b8,(char *)0x26);
                          if (backendType(QString)::ptrMatch == '\0') {
                            parseProvider();
                          }
                          local_178.d.d = (Data *)0x0;
                          local_178.d.ptr = anon_var_dwarf_adcab;
                          local_178.d.size = 4;
                          QString::replace(&local_2b8,
                                           (QRegularExpression *)&backendType(QString)::ptrMatch,
                                           &local_178);
                          if ((EnumValue *)local_178.d.d != (EnumValue *)0x0) {
                            LOCK();
                            ((__atomic_base<int> *)
                            &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i =
                                 ((__atomic_base<int> *)
                                 &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i + -1
                            ;
                            UNLOCK();
                            if (((__atomic_base<int> *)
                                &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i == 0)
                            {
                              QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          QString::trimmed_helper(&local_178,&local_2b8);
                          qVar31 = local_178.d.size;
                          pDVar10 = local_178.d.d;
                          pcVar9 = local_2b8.d.ptr;
                          pDVar26 = local_2b8.d.d;
                          local_178.d.d = local_2b8.d.d;
                          local_2b8.d.d = pDVar10;
                          local_2b8.d.ptr = local_178.d.ptr;
                          local_178.d.ptr = pcVar9;
                          local_178.d.size = local_2b8.d.size;
                          local_2b8.d.size = qVar31;
                          if ((EnumValue *)pDVar26 != (EnumValue *)0x0) {
                            LOCK();
                            ((__atomic_base<int> *)&(((QString *)&pDVar26->super_QArrayData)->d).d)
                            ->_M_i = ((__atomic_base<int> *)
                                     &(((QString *)&pDVar26->super_QArrayData)->d).d)->_M_i + -1;
                            UNLOCK();
                            if (((__atomic_base<int> *)
                                &(((QString *)&pDVar26->super_QArrayData)->d).d)->_M_i == 0) {
                              QArrayData::deallocate(&pDVar26->super_QArrayData,2,0x10);
                            }
                          }
                          local_178.d.d = (Data *)0x0;
                          local_178.d.ptr = L" ";
                          local_178.d.size = 1;
                          local_1d8[0].d.d = (Data *)0x0;
                          local_1d8[0].d.ptr = L"_";
                          local_1d8[0].d.size = 1;
                          QString::replace(&local_2b8,&local_178,local_1d8,CaseSensitive);
                          if (&(local_1d8[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_1d8[0].d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_1d8[0].d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_1d8[0].d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_1d8[0].d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          if ((EnumValue *)local_178.d.d != (EnumValue *)0x0) {
                            LOCK();
                            ((__atomic_base<int> *)
                            &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i =
                                 ((__atomic_base<int> *)
                                 &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i + -1
                            ;
                            UNLOCK();
                            if (((__atomic_base<int> *)
                                &(((QString *)&(local_178.d.d)->super_QArrayData)->d).d)->_M_i == 0)
                            {
                              QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          if ((storage_type_conflict *)local_2b8.d.size ==
                              (storage_type_conflict *)0x8) {
                            lhs_05.m_size = (qsizetype)"char_ptr";
                            lhs_05.m_data = (storage_type_conflict *)0x8;
                            rhs_05.m_size = in_R8;
                            rhs_05.m_data = (char *)0x8;
                            bVar15 = QtPrivate::equalStrings
                                               ((QtPrivate *)local_2b8.d.ptr,lhs_05,rhs_05);
                            uVar22 = 5;
                            if (bVar15) goto LAB_00111465;
                          }
                          s_01.m_size = 4;
                          s_01.m_data = "_ptr";
                          bVar15 = QString::endsWith(&local_2b8,s_01,CaseSensitive);
                          qVar31 = local_2b8.d.size;
                          pcVar9 = local_2b8.d.ptr;
                          uVar22 = 6;
                          if (!bVar15) {
                            lVar28 = 0;
                            do {
                              lVar33 = (&backendType(QString)::typeTable)[lVar28 * 2];
                              if (lVar33 == 0) {
                                psVar21 = (storage_type_conflict *)0x0;
                              }
                              else {
                                lVar23 = -1;
                                do {
                                  psVar21 = (storage_type_conflict *)(lVar23 + 1);
                                  pcVar25 = (char *)(lVar23 + lVar33 + 1);
                                  lVar23 = (long)psVar21;
                                } while (*pcVar25 != '\0');
                              }
                              if ((psVar21 == (storage_type_conflict *)qVar31) &&
                                 (lhs_06.m_size = lVar33,
                                 lhs_06.m_data = (storage_type_conflict *)qVar31,
                                 rhs_06.m_size = in_R8, rhs_06.m_data = (char *)qVar31,
                                 bVar15 = QtPrivate::equalStrings((QtPrivate *)pcVar9,lhs_06,rhs_06)
                                 , bVar15)) {
                                uVar22 = *(undefined4 *)(&UNK_00188008 + lVar28 * 0x10);
                                goto LAB_00111465;
                              }
                              lVar28 = lVar28 + 1;
                            } while (lVar28 != 0x26);
                            uVar22 = 0x10;
                          }
                        }
LAB_00111465:
                        local_d8._0_4_ = uVar22;
                        if ((EnumValue *)local_2b8.d.d != (EnumValue *)0x0) {
                          LOCK();
                          ((__atomic_base<int> *)
                          &(((QString *)&(local_2b8.d.d)->super_QArrayData)->d).d)->_M_i =
                               ((__atomic_base<int> *)
                               &(((QString *)&(local_2b8.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                          UNLOCK();
                          if (((__atomic_base<int> *)
                              &(((QString *)&(local_2b8.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                            QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                      }
                      else {
                        local_d8._0_4_ = 0xf;
                      }
                    }
                    else {
                      local_d8._0_4_ = 0xe;
                      stack0xffffffffffffff60 =
                           (undefined1 *)CONCAT44((undefined4)local_e8,local_d8._56_4_);
                    }
                    local_2d0.d.d = local_228.d.d;
                    local_2d0.d.ptr = local_228.d.ptr;
                    local_2d0.d.size = local_228.d.size;
                    if ((EnumValue *)local_228.d.d != (EnumValue *)0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(((QString *)&(local_228.d.d)->super_QArrayData)->d).d
                      )->_M_i = ((__atomic_base<int> *)
                                &(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->_M_i + 1;
                      UNLOCK();
                    }
                    removeBraces(&local_178,&local_2d0);
                    uVar11 = local_d8._16_8_;
                    uVar8 = local_d8._8_8_;
                    qVar31 = local_178.d.size;
                    pDVar26 = local_178.d.d;
                    local_178.d.d = (Data *)local_d8._8_8_;
                    local_d8._8_8_ = pDVar26;
                    local_d8._16_8_ = local_178.d.ptr;
                    local_178.d.ptr = (char16_t *)uVar11;
                    local_178.d.size = local_d8._24_8_;
                    local_d8._24_8_ = qVar31;
                    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1
                      ;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0)
                      {
                        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
                      }
                    }
                    if ((EnumValue *)local_2d0.d.d != (EnumValue *)0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(((QString *)&(local_2d0.d.d)->super_QArrayData)->d).d
                      )->_M_i = ((__atomic_base<int> *)
                                &(((QString *)&(local_2d0.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                      UNLOCK();
                      if (((__atomic_base<int> *)
                          &(((QString *)&(local_2d0.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                        QArrayData::deallocate(&(local_2d0.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QString::operator=((QString *)(local_d8 + 0x20),&local_248);
                    local_d8._56_4_ = iVar16;
                    sequenceLength(&local_178,&local_228);
                    pQVar30 = pQStack_90;
                    pEVar27 = local_98;
                    qVar31 = local_178.d.size;
                    pDVar26 = local_178.d.d;
                    local_178.d.d = (Data *)local_98;
                    local_98 = (EnumValue *)pDVar26;
                    pQStack_90 = (QtPrivate *)local_178.d.ptr;
                    local_178.d.ptr = (char16_t *)pQVar30;
                    local_178.d.size = (qsizetype)local_88;
                    local_88 = (storage_type_conflict *)qVar31;
                    if (pEVar27 != (EnumValue *)0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(pEVar27->name).d.d)->_M_i =
                           ((__atomic_base<int> *)&(pEVar27->name).d.d)->_M_i + -1;
                      UNLOCK();
                      if (((__atomic_base<int> *)&(pEVar27->name).d.d)->_M_i == 0) {
                        QArrayData::deallocate((QArrayData *)pEVar27,2,0x10);
                      }
                    }
                    QtPrivate::QMovableArrayOps<Tracepoint::Field>::emplace<Tracepoint::Field>
                              ((QMovableArrayOps<Tracepoint::Field> *)&local_3f8.fields,
                               local_3f8.fields.d.size,(Field *)local_d8);
                    QList<Tracepoint::Field>::end(&local_3f8.fields);
                    QArrayDataPointer<TraceFlags::FlagValue>::~QArrayDataPointer(&QStack_280);
                    if (local_298 != (QArrayData *)0x0) {
                      LOCK();
                      (local_298->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_298->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_298->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_298,2,0x10);
                      }
                    }
                    QArrayDataPointer<TraceEnum::EnumValue>::~QArrayDataPointer(&QStack_100);
                    if (local_118.d.d.ptr !=
                        (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0) {
                      LOCK();
                      *(int *)local_118.d.d.ptr = *(int *)local_118.d.d.ptr + -1;
                      UNLOCK();
                      if (*(int *)local_118.d.d.ptr == 0) {
                        QArrayData::deallocate((QArrayData *)local_118.d.d.ptr,2,0x10);
                      }
                    }
                    if (local_98 != (EnumValue *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)&local_98->name)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)&local_98->name)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)&local_98->name)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_98,2,0x10);
                      }
                    }
                    if ((QArrayData *)local_d8._32_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_d8._32_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_d8._32_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_d8._32_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_d8._32_8_,2,0x10);
                      }
                    }
                    if ((EnumValue *)local_d8._8_8_ != (EnumValue *)0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(((QString *)local_d8._8_8_)->d).d)->_M_i =
                           ((__atomic_base<int> *)&(((QString *)local_d8._8_8_)->d).d)->_M_i + -1;
                      UNLOCK();
                      if (((__atomic_base<int> *)&(((QString *)local_d8._8_8_)->d).d)->_M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_d8._8_8_,2,0x10);
                      }
                    }
                    if (&(local_78.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                      ._M_i = ((local_78.name.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_78.name.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_78.name.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_78.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                      ._M_i = ((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_78.type.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_248.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_248.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_248.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((EnumValue *)local_228.d.d != (EnumValue *)0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(((QString *)&(local_228.d.d)->super_QArrayData)->d).d
                      )->_M_i = ((__atomic_base<int> *)
                                &(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                      UNLOCK();
                      if (((__atomic_base<int> *)
                          &(((QString *)&(local_228.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                        QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    offset = offset + 1;
                    QRegularExpressionMatch::~QRegularExpressionMatch(local_210);
                  } while (offset != pQVar1);
                }
                QtPrivate::QMovableArrayOps<Tracepoint>::emplace<Tracepoint>
                          ((QMovableArrayOps<Tracepoint> *)&__return_storage_ptr__->tracepoints,
                           (__return_storage_ptr__->tracepoints).d.size,&local_3f8);
                QList<Tracepoint>::end(&__return_storage_ptr__->tracepoints);
                QArrayDataPointer<Tracepoint::Field>::~QArrayDataPointer(&local_3f8.fields.d);
                QArrayDataPointer<Tracepoint::Argument>::~QArrayDataPointer(&local_3f8.args.d);
                if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QArrayDataPointer<QString>::~QArrayDataPointer(&local_3a8);
                if (&(local_388.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_388.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_388.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_388.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_388.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_368.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_368.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_368.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_368.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    qVar31 = 2;
                    pQVar32 = &(local_368.d.d)->super_QArrayData;
LAB_00111ca5:
                    QArrayData::deallocate(pQVar32,qVar31,0x10);
                  }
                }
              }
              else {
                QString::toLocal8Bit_helper
                          ((QByteArray *)local_d8,(QChar *)(filename->d).ptr,(filename->d).size);
                pEVar27 = (EnumValue *)local_d8._8_8_;
                if ((EnumValue *)local_d8._8_8_ == (EnumValue *)0x0) {
                  pEVar27 = (EnumValue *)"";
                }
                QString::toLocal8Bit_helper
                          ((QByteArray *)&local_3f8,(QChar *)local_350._16_8_,local_350._24_8_);
                pcVar25 = (char *)local_3f8.name.d.ptr;
                if ((EnumValue *)local_3f8.name.d.ptr == (EnumValue *)0x0) {
                  pcVar25 = "";
                }
                panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' does not look like a tracepoint definition"
                      ,pEVar27,(ulong)uVar29,pcVar25);
                if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    qVar31 = 1;
                    pQVar32 = (QArrayData *)local_d8._0_8_;
                    goto LAB_00111ca5;
                  }
                }
              }
              this = (Argument *)local_350;
              goto LAB_00111a03;
            }
            local_118.d.d.ptr =
                 (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa
            ;
            in_R8 = 0;
            QRegularExpression::match
                      ((QRegularExpression *)&local_118,(QString *)&parseProvider::enumdef,
                       (qsizetype)(local_350 + 8),NormalMatch,(MatchOptions)0x0);
LAB_001104da:
            bVar15 = QRegularExpressionMatch::hasMatch(&local_118);
            if (bVar15) {
              bVar15 = QRegularExpressionMatch::hasCaptured(&local_118,3);
              if (bVar15) {
                if (bVar6) {
                  local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_d8._0_8_ = (QArrayData *)0x0;
                  local_d8._8_8_ = (EnumValue *)0x0;
                  local_d8._16_8_ = (QtPrivate *)0x0;
                  QRegularExpressionMatch::captured(&local_3f8.name,&local_118,1);
                  uVar11 = local_d8._8_8_;
                  uVar8 = local_d8._0_8_;
                  qVar31 = local_3f8.name.d.size;
                  pDVar26 = local_3f8.name.d.d;
                  local_3f8.name.d.d = (Data *)local_d8._0_8_;
                  local_d8._0_8_ = pDVar26;
                  local_d8._8_8_ = local_3f8.name.d.ptr;
                  local_3f8.name.d.ptr = (char16_t *)uVar11;
                  local_3f8.name.d.size = local_d8._16_8_;
                  local_d8._16_8_ = qVar31;
                  if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
                    }
                  }
                  QRegularExpressionMatch::captured(&local_3f8.name,&local_118,3);
                  string_01.m_size = 0;
                  string_01.m_data = (storage_type_conflict *)local_3f8.name.d.size;
                  qVar19 = QString::toIntegral_helper
                                     ((QString *)local_3f8.name.d.ptr,string_01,(bool *)0xa,
                                      (int)in_R8);
                  iVar16 = (int)qVar19;
                  if (iVar16 != qVar19) {
                    iVar16 = 0;
                  }
                  local_d8._24_4_ = iVar16;
                  if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  uVar11 = local_d8._24_8_;
                  local_d8._24_8_ = local_d8._24_8_ & 0xffffffff;
                  uVar8 = local_d8._24_8_;
                  local_d8._24_4_ = (undefined4)uVar11;
                  uVar22 = local_d8._24_4_;
                  local_d8._24_8_ = uVar8;
                  QList<TraceEnum::EnumValue>::push_back
                            ((QList<TraceEnum::EnumValue> *)(local_158 + 0x18),
                             (parameter_type)local_d8);
                  if ((int)local_45c <= (int)local_d8._24_4_) {
                    local_45c = local_d8._24_4_;
                  }
                  uVar18 = local_d8._24_4_;
                  if ((int)local_458 < (int)local_d8._24_4_) {
                    uVar18 = local_458;
                  }
                  if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                    }
                  }
                  local_460 = uVar22 + 1;
                  local_458 = uVar18;
                }
                else {
                  local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_d8._0_8_ = (QArrayData *)0x0;
                  local_d8._8_8_ = (EnumValue *)0x0;
                  local_d8._16_8_ = (QtPrivate *)0x0;
                  QRegularExpressionMatch::captured(&local_3f8.name,&local_118,1);
                  uVar11 = local_d8._8_8_;
                  uVar8 = local_d8._0_8_;
                  qVar31 = local_3f8.name.d.size;
                  pDVar26 = local_3f8.name.d.d;
                  local_3f8.name.d.d = (Data *)local_d8._0_8_;
                  local_d8._0_8_ = pDVar26;
                  local_d8._8_8_ = local_3f8.name.d.ptr;
                  local_3f8.name.d.ptr = (char16_t *)uVar11;
                  local_3f8.name.d.size = local_d8._16_8_;
                  local_d8._16_8_ = qVar31;
                  if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
                    }
                  }
                  QRegularExpressionMatch::captured(&local_3f8.name,&local_118,3);
                  local_78.type.d.d = (Data *)0x0;
                  local_78.type.d.ptr = L"0x";
                  local_78.type.d.size = 2;
                  bVar15 = QString::startsWith(&local_3f8.name,&local_78.type,CaseSensitive);
                  if (&(local_78.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i = ((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_78.type.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (bVar15) {
                    QRegularExpressionMatch::captured(&local_3f8.name,&local_118,3);
                    ok = (bool *)0x10;
                  }
                  else {
                    QRegularExpressionMatch::captured(&local_3f8.name,&local_118,3);
                    ok = (bool *)0xa;
                  }
                  string_02.m_size = 0;
                  string_02.m_data = (storage_type_conflict *)local_3f8.name.d.size;
                  qVar19 = QString::toIntegral_helper
                                     ((QString *)local_3f8.name.d.ptr,string_02,ok,(int)in_R8);
                  iVar16 = (int)qVar19;
                  if (iVar16 != qVar19) {
                    iVar16 = 0;
                  }
                  local_d8._24_4_ = iVar16;
                  if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((local_d8._24_4_ & local_d8._24_4_ - 1) == 0) {
                    if (local_d8._24_4_ == 0) {
                      uVar18 = 0x20;
                    }
                    else {
                      uVar18 = 0x1f;
                      if (local_d8._24_4_ != 0) {
                        for (; (uint)local_d8._24_4_ >> uVar18 == 0; uVar18 = uVar18 - 1) {
                        }
                      }
                      uVar18 = uVar18 ^ 0x1f;
                    }
                    local_d8._24_4_ = 0x20 - uVar18;
                    QList<TraceFlags::FlagValue>::push_back
                              ((QList<TraceFlags::FlagValue> *)&QStack_310,(parameter_type)local_d8)
                    ;
                  }
                  else {
                    QString::toLocal8Bit_helper
                              ((QByteArray *)&local_3f8,(QChar *)(filename->d).ptr,
                               (filename->d).size);
                    pcVar25 = (char *)local_3f8.name.d.ptr;
                    if ((EnumValue *)local_3f8.name.d.ptr == (EnumValue *)0x0) {
                      pcVar25 = "";
                    }
                    QString::toLocal8Bit_helper
                              ((QByteArray *)&local_78,(QChar *)local_350._16_8_,local_350._24_8_);
                    pQVar24 = (QChar *)local_78.type.d.ptr;
                    if ((QChar *)local_78.type.d.ptr == (QChar *)0x0) {
                      pQVar24 = (QChar *)"";
                    }
                    printf("Warning: \'%s\' line %d:\n    \'%s\' flag value is not power of two.\n",
                           pcVar25,(ulong)uVar29,pQVar24);
                    if (&(local_78.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_78.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                      ._M_i = ((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_78.type.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_78.type.d.d)->super_QArrayData,1,0x10);
                      }
                    }
                    if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i =
                           ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,1,0x10);
                      }
                    }
                  }
                  if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      qVar31 = 2;
                      goto LAB_001118ac;
                    }
                  }
                }
              }
              else {
                if ((int)local_45c <= (int)local_460) {
                  local_45c = local_460;
                }
                if ((int)local_460 <= (int)local_458) {
                  local_458 = local_460;
                }
                if (bVar6) {
                  QRegularExpressionMatch::captured((QString *)local_d8,&local_118,0);
                  local_d8._28_4_ = 0;
                  local_d8._24_4_ = local_460;
                  QList<TraceEnum::EnumValue>::push_back
                            ((QList<TraceEnum::EnumValue> *)(local_158 + 0x18),(rvalue_ref)local_d8)
                  ;
                  if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
                    }
                  }
                  local_460 = local_460 + 1;
                }
                else {
                  QString::toLocal8Bit_helper
                            ((QByteArray *)local_d8,(QChar *)(filename->d).ptr,(filename->d).size);
                  pEVar27 = (EnumValue *)local_d8._8_8_;
                  if ((EnumValue *)local_d8._8_8_ == (EnumValue *)0x0) {
                    pEVar27 = (EnumValue *)"";
                  }
                  QString::toLocal8Bit_helper
                            ((QByteArray *)&local_3f8,(QChar *)local_350._16_8_,local_350._24_8_);
                  pcVar25 = (char *)local_3f8.name.d.ptr;
                  if ((EnumValue *)local_3f8.name.d.ptr == (EnumValue *)0x0) {
                    pcVar25 = "";
                  }
                  panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' flags value not set"
                        ,pEVar27,(ulong)uVar29,pcVar25);
                  if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,1,0x10);
                    }
                  }
                  if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
                    }
                  }
                }
              }
            }
            else {
              QString::toLocal8Bit_helper
                        ((QByteArray *)local_d8,(QChar *)(filename->d).ptr,(filename->d).size);
              pEVar27 = (EnumValue *)local_d8._8_8_;
              if ((EnumValue *)local_d8._8_8_ == (EnumValue *)0x0) {
                pEVar27 = (EnumValue *)"";
              }
              QString::toLocal8Bit_helper
                        ((QByteArray *)&local_3f8,(QChar *)local_350._16_8_,local_350._24_8_);
              pcVar25 = (char *)local_3f8.name.d.ptr;
              if ((EnumValue *)local_3f8.name.d.ptr == (EnumValue *)0x0) {
                pcVar25 = "";
              }
              panic("Syntax error while processing \'%s\' line %d:\n    \'%s\' enum/flags does not match"
                    ,pEVar27,(ulong)uVar29,pcVar25);
              if (&(local_3f8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_3f8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_3f8.name.d.d)->super_QArrayData,1,0x10);
                }
              }
              if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  qVar31 = 1;
LAB_001118ac:
                  QArrayData::deallocate((QArrayData *)local_d8._0_8_,qVar31,0x10);
                }
              }
            }
          }
          QRegularExpressionMatch::~QRegularExpressionMatch(&local_118);
        }
      }
      if ((QArrayData *)local_350._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_350._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_350._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_350._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_350._8_8_,2,0x10);
        }
      }
      uVar29 = uVar29 + 1;
      bVar15 = QTextStream::atEnd(&local_2f0);
    } while (!bVar15);
    if (bVar14) {
      QString::toLocal8Bit_helper
                ((QByteArray *)local_d8,(QChar *)(filename->d).ptr,(filename->d).size);
      pEVar27 = (EnumValue *)local_d8._8_8_;
      if ((EnumValue *)local_d8._8_8_ == (EnumValue *)0x0) {
        pEVar27 = (EnumValue *)"";
      }
      panic("Syntax error while processing \'%s\': no closing brace found for prefix text block",
            pEVar27);
      if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
        }
      }
    }
  }
  QArrayDataPointer<TraceFlags::FlagValue>::~QArrayDataPointer(&QStack_310);
  if ((QArrayData *)local_350._40_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_350._40_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_350._40_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_350._40_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_350._40_8_,2,0x10);
    }
  }
  QArrayDataPointer<TraceEnum::EnumValue>::~QArrayDataPointer
            ((QArrayDataPointer<TraceEnum::EnumValue> *)(local_158 + 0x18));
  if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_158._0_8_,2,0x10);
    }
  }
  QTextStream::~QTextStream(&local_2f0);
  QFile::~QFile((QFile *)&local_2e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Provider parseProvider(const QString &filename)
{
    QFile f(filename);

    if (!f.open(QIODevice::ReadOnly | QIODevice::Text))
        panic("Cannot open %s: %s", qPrintable(filename), qPrintable(f.errorString()));

    QTextStream s(&f);

    static const QRegularExpression tracedef(QStringLiteral("^([A-Za-z][A-Za-z0-9_]*)\\((.*)\\)$"));
    static const QRegularExpression enumenddef(QStringLiteral("^} ?([A-Za-z][A-Za-z0-9_:]*);"));
    static const QRegularExpression enumdef(QStringLiteral("^([A-Za-z][A-Za-z0-9_]*)( *= *([xabcdef0-9]*))?"));
    static const QRegularExpression rangedef(QStringLiteral("^RANGE\\(([A-Za-z][A-Za-z0-9_]*) ?, ?([0-9]*) ?... ?([0-9]*) ?\\)"));

    Provider provider;
    provider.name = QFileInfo(filename).baseName();

    bool parsingPrefixText = false;
    bool parsingEnum = false;
    bool parsingFlags = false;
    TraceEnum currentEnum;
    TraceFlags currentFlags;
    int currentEnumValue = 0;
    int minEnumValue = std::numeric_limits<int>::max();
    int maxEnumValue = std::numeric_limits<int>::min();
    for (int lineNumber = 1; !s.atEnd(); ++lineNumber) {
        QString line = s.readLine().trimmed();

        if (line == "{"_L1) {
            parsingPrefixText = true;
            continue;
        } else if (parsingPrefixText && line == "}"_L1) {
            parsingPrefixText = false;
            continue;
        } else if (parsingPrefixText) {
            provider.prefixText.append(line);
            continue;
        } else if (line == "ENUM {"_L1) {
            parsingEnum = true;
            continue;
        } else if (line == "FLAGS {"_L1) {
            parsingFlags = true;
            continue;
        } else if (line.startsWith("}"_L1) && (parsingEnum || parsingFlags)) {
            auto match = enumenddef.match(line);
            if (match.hasMatch()) {
                if (parsingEnum) {
                    currentEnum.name = match.captured(1);
                    currentEnum.valueSize = minumumValueSize(minEnumValue, maxEnumValue);
                    provider.enumerations.push_back(currentEnum);
                    currentEnum = TraceEnum();
                    parsingEnum = false;
                } else {
                    currentFlags.name = match.captured(1);
                    provider.flags.push_back(currentFlags);
                    currentFlags = TraceFlags();
                    parsingFlags = false;
                }

                minEnumValue = std::numeric_limits<int>::max();
                maxEnumValue = std::numeric_limits<int>::min();
            } else {
                panic("Syntax error while processing '%s' line %d:\n"
                      "    '%s' end of enum/flags does not match",
                      qPrintable(filename), lineNumber,
                      qPrintable(line));
            }

            continue;
        }

        if (line.isEmpty() || line.startsWith(u'#'))
            continue;

        if (parsingEnum || parsingFlags) {
            auto m = enumdef.match(line);
            if (parsingEnum && line.startsWith(QStringLiteral("RANGE"))) {
                auto m = rangedef.match(line);
                if (m.hasMatch()) {
                    TraceEnum::EnumValue value;
                    value.name = m.captured(1);
                    value.value = m.captured(2).toInt();
                    value.range = m.captured(3).toInt();
                    currentEnumValue = value.range + 1;
                    currentEnum.values.push_back(value);
                    maxEnumValue = qMax(maxEnumValue, value.range);
                    minEnumValue = qMin(minEnumValue, value.value);
                }
            } else if (m.hasMatch()) {
                if (m.hasCaptured(3)) {
                    if (parsingEnum) {
                        TraceEnum::EnumValue value;
                        value.name = m.captured(1);
                        value.value = m.captured(3).toInt();
                        value.range = 0;
                        currentEnumValue = value.value + 1;
                        currentEnum.values.push_back(value);
                        maxEnumValue = qMax(maxEnumValue, value.value);
                        minEnumValue = qMin(minEnumValue, value.value);
                    } else {
                        TraceFlags::FlagValue value;
                        value.name = m.captured(1);
                        if (m.captured(3).startsWith(QStringLiteral("0x")))
                            value.value = m.captured(3).toInt(nullptr, 16);
                        else
                            value.value = m.captured(3).toInt();
                        if (!isPow2OrZero(value.value)) {
                            printf("Warning: '%s' line %d:\n"
                                  "    '%s' flag value is not power of two.\n",
                                  qPrintable(filename), lineNumber,
                                  qPrintable(line));
                        } else {
                            value.value = pow2Log2(value.value);
                            currentFlags.values.push_back(value);
                        }
                    }
                } else {
                    maxEnumValue = qMax(maxEnumValue, currentEnumValue);
                    minEnumValue = qMin(minEnumValue, currentEnumValue);
                    if (parsingEnum) {
                        currentEnum.values.push_back({m.captured(0), currentEnumValue++, 0});
                    } else {
                        panic("Syntax error while processing '%s' line %d:\n"
                              "    '%s' flags value not set",
                              qPrintable(filename), lineNumber,
                              qPrintable(line));
                    }
                }
            } else {
                panic("Syntax error while processing '%s' line %d:\n"
                      "    '%s' enum/flags does not match",
                      qPrintable(filename), lineNumber,
                      qPrintable(line));
            }
            continue;
        }

        auto match = tracedef.match(line);
        if (match.hasMatch()) {
            const QString name = match.captured(1);
            const QString argsString = match.captured(2);
            const QStringList args = argsString.split(u',', Qt::SkipEmptyParts);

            provider.tracepoints << parseTracepoint(provider, name, args, filename, lineNumber);
        } else {
            panic("Syntax error while processing '%s' line %d:\n"
                  "    '%s' does not look like a tracepoint definition",
                  qPrintable(filename), lineNumber,
                  qPrintable(line));
        }
    }

    if (parsingPrefixText) {
        panic("Syntax error while processing '%s': "
              "no closing brace found for prefix text block",
              qPrintable(filename));
    }

#ifdef TRACEGEN_DEBUG
    qDebug() << provider.prefixText;
    for (auto i = provider.tracepoints.constBegin(); i != provider.tracepoints.constEnd(); ++i)
        dumpTracepoint(*i);
#endif

    return provider;
}